

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264StreamReader.cpp
# Opt level: O2

int __thiscall H264StreamReader::processSEI(H264StreamReader *this,uint8_t *buff)

{
  uint8_t **ppuVar1;
  uint8_t *puVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  uint8_t *end;
  __node_base _Var9;
  undefined4 *puVar10;
  uint *local_f90;
  undefined8 local_f88;
  uint local_f80;
  undefined4 uStack_f7c;
  undefined4 uStack_f78;
  undefined4 uStack_f74;
  uint *local_f70;
  undefined8 local_f68;
  uint local_f60;
  undefined4 uStack_f5c;
  undefined4 uStack_f58;
  undefined4 uStack_f54;
  SEIUnit lastSEI;
  ostringstream ss;
  uint8_t tmpBuff [3072];
  uint8_t local_38 [8];
  
  if ((this->m_spsMap)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    lastSEI.m_processedMessages._M_h._M_buckets = &lastSEI.m_processedMessages._M_h._M_single_bucket
    ;
    lastSEI.super_NALUnit.bitReader.super_BitStream.m_totalBits = 0;
    lastSEI.super_NALUnit.bitReader.super_BitStream.m_buffer = (uint *)0x0;
    lastSEI.super_NALUnit.bitReader.super_BitStream.m_initBuffer = (uint *)0x0;
    lastSEI.super_NALUnit.bitReader.m_curVal = 0;
    lastSEI.super_NALUnit.bitReader.m_bitLeft = 0;
    lastSEI.super_NALUnit.nal_unit_type = nuUnspecified;
    lastSEI.super_NALUnit.nal_ref_idc = 0;
    lastSEI.super_NALUnit.m_nalBuffer = (uint8_t *)0x0;
    lastSEI.super_NALUnit.m_nalBufferLen = 0;
    lastSEI.super_NALUnit._vptr_NALUnit = (_func_int **)&PTR__SEIUnit_0024a4f0;
    lastSEI.pic_struct = '\0';
    lastSEI.m_processedMessages._M_h._M_bucket_count = 1;
    lastSEI.m_processedMessages._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    lastSEI.m_processedMessages._M_h._M_element_count = 0;
    lastSEI.m_processedMessages._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    memset(&lastSEI.m_processedMessages._M_h._M_rehash_policy._M_next_resize,0,0x118);
    lastSEI.number_of_offset_sequences = -1;
    lastSEI.metadataPtsOffset = 0;
    lastSEI.m_mvcHeaderLen = 0;
    lastSEI.m_mvcHeaderStart = (uint8_t *)0x0;
    end = NALUnit::findNALWithStartCode
                    (buff,(this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd,true);
    puVar2 = (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd;
    if (puVar2 < end + 4 || end == puVar2) {
      bVar5 = false;
      iVar8 = -10;
    }
    else {
      lastSEI.pic_struct = -1;
      NALUnit::decodeBuffer(&lastSEI.super_NALUnit,buff,end);
      uVar7 = (uint)this->orig_vcl_parameters_present_flag;
      if (this->orig_hrd_parameters_present_flag != false) {
        uVar7 = 1;
      }
      SEIUnit::deserialize
                (&lastSEI,(SPSUnit *)
                          (this->m_spsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1].
                          _M_parent,uVar7);
      bVar4 = 0;
      bVar3 = 0;
      for (_Var9 = lastSEI.m_processedMessages._M_h._M_before_begin;
          _Var9._M_nxt != (_Hash_node_base *)0x0; _Var9._M_nxt = (_Var9._M_nxt)->_M_nxt) {
        iVar8 = *(int *)&_Var9._M_nxt[1]._M_nxt;
        bVar6 = 1;
        if ((iVar8 != 0) && (bVar6 = bVar3, iVar8 != 0x25)) {
          if (iVar8 == 1) {
            this->m_lastPictStruct = lastSEI.pic_struct;
            bVar6 = 1;
          }
          else {
            bVar4 = 1;
          }
        }
        bVar3 = bVar6;
      }
      if (this->m_mvcSubStream != false) {
        if (-1 < lastSEI.number_of_offset_sequences) {
          if (this->m_needSeiCorrection == true) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      (&this->m_bdRomMetaDataMsg,(ulong)lastSEI.super_NALUnit.m_nalBufferLen);
            this->m_bdRomMetaDataMsgPtsPos = lastSEI.metadataPtsOffset;
            memcpy((this->m_bdRomMetaDataMsg).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,lastSEI.super_NALUnit.m_nalBuffer,
                   (ulong)lastSEI.super_NALUnit.m_nalBufferLen);
          }
          else {
            this->m_priorityNalAddr = buff;
            this->m_OffsetMetadataPtsAddr = buff + lastSEI.metadataPtsOffset;
          }
        }
        if ((bool)(0 < lastSEI.m_mvcHeaderLen & bVar3)) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    (&this->m_lastSeiMvcHeader,(ulong)(uint)lastSEI.m_mvcHeaderLen);
          memcpy((this->m_lastSeiMvcHeader).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,lastSEI.m_mvcHeaderStart,
                 (long)lastSEI.m_mvcHeaderLen);
          bVar3 = 1;
        }
      }
      iVar8 = 0;
      if ((bool)(bVar3 & bVar4)) {
        bVar5 = true;
        iVar8 = 0;
        if (this->m_needSeiCorrection == true) {
          SEIUnit::removePicTimingSEI
                    (&lastSEI,(SPSUnit *)
                              (this->m_spsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
                              [1]._M_parent);
          uVar7 = NALUnit::serializeBuffer(&lastSEI.super_NALUnit,tmpBuff,local_38,false);
          if (uVar7 == 0xffffffff) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
            std::operator<<((ostream *)&ss,"Not enough buffer");
            puVar10 = (undefined4 *)__cxa_allocate_exception(0x28);
            std::__cxx11::stringbuf::str();
            *puVar10 = 3;
            *(undefined4 **)(puVar10 + 2) = puVar10 + 6;
            if (local_f70 == &local_f60) {
              puVar10[6] = local_f60;
              puVar10[7] = uStack_f5c;
              puVar10[8] = uStack_f58;
              puVar10[9] = uStack_f54;
            }
            else {
              *(uint **)(puVar10 + 2) = local_f70;
              *(ulong *)(puVar10 + 6) = CONCAT44(uStack_f5c,local_f60);
            }
            *(undefined8 *)(puVar10 + 4) = local_f68;
            local_f68 = 0;
            local_f60 = local_f60 & 0xffffff00;
            local_f70 = &local_f60;
            __cxa_throw(puVar10,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
          }
          if ((int)uVar7 < 3) {
            __assert_fail("newSize > 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/justdan96[P]tsMuxer/tsMuxer/h264StreamReader.cpp"
                          ,0x3e6,"int H264StreamReader::processSEI(uint8_t *)");
          }
          iVar8 = ((int)buff - (int)end) + uVar7;
          if (iVar8 != 0) {
            puVar2 = (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd;
            if ((this->super_MPEGStreamReader).m_tmpBuffer + 0x800000 < puVar2 + iVar8) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
              std::operator<<((ostream *)&ss,"Not enough buffer");
              puVar10 = (undefined4 *)__cxa_allocate_exception(0x28);
              std::__cxx11::stringbuf::str();
              *puVar10 = 3;
              *(undefined4 **)(puVar10 + 2) = puVar10 + 6;
              if (local_f90 == &local_f80) {
                puVar10[6] = local_f80;
                puVar10[7] = uStack_f7c;
                puVar10[8] = uStack_f78;
                puVar10[9] = uStack_f74;
              }
              else {
                *(uint **)(puVar10 + 2) = local_f90;
                *(ulong *)(puVar10 + 6) = CONCAT44(uStack_f7c,local_f80);
              }
              *(undefined8 *)(puVar10 + 4) = local_f88;
              local_f80 = local_f80 & 0xffffff00;
              __cxa_throw(puVar10,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
            }
            memmove(end + iVar8,end,(long)puVar2 - (long)end);
            ppuVar1 = &(this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd;
            *ppuVar1 = *ppuVar1 + iVar8;
          }
          memcpy(buff,tmpBuff,(ulong)uVar7);
          iVar8 = 0;
        }
      }
      else {
        bVar5 = (bool)(bVar3 ^ 1 | bVar4);
      }
    }
    SEIUnit::~SEIUnit(&lastSEI);
    if (!bVar5) {
      return iVar8;
    }
  }
  return 0;
}

Assistant:

bool H264StreamReader::findPPSForward(uint8_t *buff)
{
    bool spsFound = false;
    bool ppsFound = false;
    for (uint8_t *nal = NALUnit::findNextNAL(buff, m_bufEnd); nal != m_bufEnd;
         nal = NALUnit::findNextNAL(nal, m_bufEnd))
        switch (static_cast<NALUnit::NALType>(*nal & 0x1f))
        {
        case NALUnit::NALType::nuSPS:
        case NALUnit::NALType::nuSubSPS:
            processSPS(nal);
            spsFound = true;
            break;
        case NALUnit::NALType::nuPPS:
            processPPS(nal);
            ppsFound = true;
            break;
        default:
            break;
        }
    return spsFound && ppsFound;
}